

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O0

InplaceStr GetTypeNameInScope(ExpressionContext *ctx,ScopeData *scope,InplaceStr str)

{
  InplaceStr IVar1;
  bool bVar2;
  undefined1 __src [8];
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined1 local_78 [8];
  InplaceStr nsName;
  ScopeData *curr_1;
  char *pcStack_58;
  uint strLength;
  char *pos;
  char *name;
  ScopeData *curr;
  uint nameLength;
  bool foundNamespace;
  ScopeData *scope_local;
  ExpressionContext *ctx_local;
  InplaceStr str_local;
  char *local_10;
  char *strBegin;
  
  str_local.begin = str.end;
  ctx_local = (ExpressionContext *)str.begin;
  bVar2 = false;
  curr._0_4_ = InplaceStr::length((InplaceStr *)&ctx_local);
  name = (char *)scope;
  while ((name != (char *)0x0 &&
         (((*(long *)(name + 0x20) == 0 && (*(long *)(name + 0x18) == 0)) || (bVar2))))) {
    if (*(long *)(name + 0x10) != 0) {
      uVar4 = InplaceStr::length((InplaceStr *)(*(long *)(name + 0x10) + 0x80));
      curr._0_4_ = uVar4 + 1 + (uint)curr;
      bVar2 = true;
    }
    name = *(char **)name;
  }
  if (bVar2) {
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)((uint)curr + 1));
    strBegin = (char *)CONCAT44(extraout_var,iVar3);
    pcStack_58 = strBegin + ((ulong)((uint)curr + 1) - 1);
    *pcStack_58 = '\0';
    uVar4 = InplaceStr::length((InplaceStr *)&ctx_local);
    nsName.end = (char *)scope;
    if (uVar4 != 0) {
      pcStack_58 = pcStack_58 + -(ulong)uVar4;
      memcpy(pcStack_58,ctx_local,(ulong)uVar4);
    }
    for (; nsName.end != (char *)0x0; nsName.end = *(char **)nsName.end) {
      if (*(long *)(nsName.end + 0x10) != 0) {
        local_78 = *(undefined1 (*) [8])(*(long *)(nsName.end + 0x10) + 0x80);
        nsName.begin = *(char **)(*(long *)(nsName.end + 0x10) + 0x88);
        pcStack_58[-1] = '.';
        uVar4 = InplaceStr::length((InplaceStr *)local_78);
        __src = local_78;
        pcStack_58 = pcStack_58 + -1 + -(ulong)uVar4;
        uVar4 = InplaceStr::length((InplaceStr *)local_78);
        memcpy(pcStack_58,(void *)__src,(ulong)uVar4);
      }
    }
    if (pcStack_58 != strBegin) {
      __assert_fail("pos == name",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                    ,0x23c,
                    "InplaceStr GetTypeNameInScope(ExpressionContext &, ScopeData *, InplaceStr)");
    }
    InplaceStr::InplaceStr((InplaceStr *)&str_local.end,strBegin);
  }
  else {
    str_local.end = (char *)ctx_local;
    local_10 = str_local.begin;
  }
  IVar1.end = local_10;
  IVar1.begin = str_local.end;
  return IVar1;
}

Assistant:

InplaceStr GetTypeNameInScope(ExpressionContext &ctx, ScopeData *scope, InplaceStr str)
{
	bool foundNamespace = false;

	unsigned nameLength = str.length();

	for(ScopeData *curr = scope; curr; curr = curr->scope)
	{
		if((curr->ownerType || curr->ownerFunction) && !foundNamespace)
			break;

		if(curr->ownerNamespace)
		{
			nameLength += curr->ownerNamespace->name.name.length() + 1;

			foundNamespace = true;
		}
	}

	nameLength += 1;

	if(!foundNamespace)
		return str;

	char *name = (char*)ctx.allocator->alloc(nameLength);

	// Format a string back-to-front
	char *pos = name + nameLength;

	pos -= 1;
	*pos = 0;

	if(unsigned strLength = str.length())
	{
		pos -= strLength;
		memcpy(pos, str.begin, strLength);
	}

	for(ScopeData *curr = scope; curr; curr = curr->scope)
	{
		if(curr->ownerNamespace)
		{
			InplaceStr nsName = curr->ownerNamespace->name.name;

			pos -= 1;
			*pos = '.';

			pos -= nsName.length();
			memcpy(pos, nsName.begin, nsName.length());
		}
	}

	assert(pos == name);

	return InplaceStr(name);
}